

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::IntegerAverageOperationHugeint>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  long *plVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar7 = uVar6 + 0x40;
          if (count <= uVar6 + 0x40) {
            uVar7 = count;
          }
LAB_0191ece2:
          lVar11 = uVar7 - uVar6;
          uVar8 = uVar6;
          if (uVar6 <= uVar7 && lVar11 != 0) {
            uVar12 = *(ulong *)(state + 8);
            do {
              uVar8 = *(ulong *)(pdVar3 + uVar6 * 8);
              uVar12 = uVar12 + uVar8;
              if (-1 < (long)uVar8 != uVar8 <= uVar12) {
                *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar8 >> 0x3f | 1U);
              }
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
            *(long *)state = lVar11 + *(long *)state;
            *(ulong *)(state + 8) = uVar12;
            uVar8 = uVar7;
          }
        }
        else {
          uVar12 = puVar1[uVar5];
          uVar7 = uVar6 + 0x40;
          if (count <= uVar6 + 0x40) {
            uVar7 = count;
          }
          if (uVar12 == 0xffffffffffffffff) goto LAB_0191ece2;
          uVar8 = uVar7;
          if ((uVar12 != 0) && (uVar8 = uVar6, uVar6 < uVar7)) {
            uVar13 = 0;
            do {
              if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                uVar8 = *(ulong *)(pdVar3 + uVar13 * 8 + uVar6 * 8);
                lVar11 = *(long *)(state + 8);
                *(ulong *)(state + 8) = lVar11 + uVar8;
                if (-1 < (long)uVar8 != uVar8 <= lVar11 + uVar8) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar8 >> 0x3f | 1U);
                }
              }
              uVar13 = uVar13 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar6 != uVar13);
          }
        }
        uVar5 = uVar5 + 1;
        uVar6 = uVar8;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      plVar2 = (long *)input->data;
      *(idx_t *)state = *(long *)state + count;
      AddToHugeint::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,long>
                ((AvgState<duckdb::hugeint_t> *)state,*plVar2,count);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_70);
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_70.sel)->sel_vector;
        uVar6 = *(ulong *)(state + 8);
        iVar9 = 0;
        do {
          iVar10 = iVar9;
          if (psVar4 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar4[iVar9];
          }
          uVar5 = *(ulong *)(local_70.data + iVar10 * 8);
          uVar6 = uVar6 + uVar5;
          if (-1 < (long)uVar5 != uVar5 <= uVar6) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar5 >> 0x3f | 1U);
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
        *(idx_t *)state = *(long *)state + count;
        *(ulong *)(state + 8) = uVar6;
      }
    }
    else if (count != 0) {
      psVar4 = (local_70.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar9];
        }
        if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) != 0) {
          *(long *)state = *(long *)state + 1;
          uVar6 = *(ulong *)(local_70.data + iVar10 * 8);
          lVar11 = *(long *)(state + 8);
          *(ulong *)(state + 8) = lVar11 + uVar6;
          if (-1 < (long)uVar6 != uVar6 <= lVar11 + uVar6) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar6 >> 0x3f | 1U);
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}